

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFFormValue::extractValue
          (DWARFFormValue *this,DWARFDataExtractor *Data,uint64_t *OffsetPtr,FormParams FP,
          DWARFContext *Ctx,DWARFUnit *CU)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  char *pcVar7;
  ulong uVar8;
  uint64_t *SecNdx;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  FormParams local_34 [2];
  FormParams FP_local;
  
  uVar11 = (uint)FP >> 0x10;
  if (CU != (DWARFUnit *)0x0 && Ctx == (DWARFContext *)0x0) {
    Ctx = CU->Context;
  }
  this->C = Ctx;
  this->U = CU;
  (this->Value).data = (uint8_t *)0x0;
  uVar8 = (ulong)this->Form;
LAB_00d9b216:
  uVar3 = (uint)uVar8 & 0xffff;
  switch(uVar3) {
  case 1:
  case 0x10:
    if ((short)uVar8 != 1) {
      bVar4 = dwarf::FormParams::getRefAddrByteSize(local_34);
      uVar11 = (uint)bVar4;
    }
    uVar11 = uVar11 & 0xff;
    SecNdx = &(this->Value).SectionIndex;
LAB_00d9b2a7:
    pcVar7 = (char *)DWARFDataExtractor::getRelocatedValue
                               (Data,uVar11,OffsetPtr,SecNdx,(Error *)0x0);
LAB_00d9b2af:
    (this->Value).field_0.uval = (uint64_t)pcVar7;
    return true;
  case 2:
  case 0x21:
  case 0x22:
  case 0x2b:
switchD_00d9b229_caseD_2:
    llvm_unreachable_internal
              ("unsupported form",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFFormValue.cpp"
               ,0x15d);
  case 3:
    uVar5 = DataExtractor::getU16(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    uVar8 = (ulong)uVar5;
    break;
  case 4:
    uVar6 = DataExtractor::getU32(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    uVar8 = (ulong)uVar6;
    break;
  case 5:
  case 0x12:
  case 0x26:
  case 0x2a:
    uVar5 = DataExtractor::getU16(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    pcVar7 = (char *)(ulong)uVar5;
    goto LAB_00d9b2af;
  case 6:
  case 0x13:
  case 0x1c:
  case 0x28:
  case 0x2c:
    uVar11 = 4;
    goto LAB_00d9b29f;
  case 7:
  case 0x14:
  case 0x24:
    uVar11 = 8;
    goto LAB_00d9b29f;
  case 8:
    pcVar7 = DataExtractor::getCStr(&Data->super_DataExtractor,OffsetPtr);
    goto LAB_00d9b2af;
  case 9:
  case 0x18:
    uVar8 = DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    break;
  case 10:
    bVar4 = DataExtractor::getU8(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    uVar8 = (ulong)bVar4;
    break;
  case 0xb:
  case 0xc:
  case 0x11:
  case 0x25:
  case 0x29:
    bVar4 = DataExtractor::getU8(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    pcVar7 = (char *)(ulong)bVar4;
    goto LAB_00d9b2af;
  case 0xd:
    pcVar7 = (char *)DataExtractor::getSLEB128(&Data->super_DataExtractor,OffsetPtr);
    goto LAB_00d9b2af;
  case 0xe:
  case 0x17:
  case 0x1d:
  case 0x1f:
    goto switchD_00d9b229_caseD_e;
  case 0xf:
  case 0x15:
  case 0x1a:
  case 0x1b:
  case 0x23:
switchD_00d9b229_caseD_f:
    pcVar7 = (char *)DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    goto LAB_00d9b2af;
  case 0x16:
    goto switchD_00d9b229_caseD_16;
  case 0x19:
    (this->Value).field_0.uval = 1;
    return true;
  case 0x1e:
    uVar8 = 0x10;
    break;
  case 0x20:
    pcVar7 = (char *)DataExtractor::getU64(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
    goto LAB_00d9b2af;
  case 0x27:
    uVar6 = DataExtractor::getU24(&Data->super_DataExtractor,OffsetPtr);
    pcVar7 = (char *)(ulong)uVar6;
    goto LAB_00d9b2af;
  default:
    if (uVar3 - 0x1f01 < 2) goto switchD_00d9b229_caseD_f;
    if (1 < uVar3 - 0x1f20) goto switchD_00d9b229_caseD_2;
    goto switchD_00d9b229_caseD_e;
  }
  (this->Value).field_0.uval = uVar8;
  pcVar7 = (Data->super_DataExtractor).Data.Data;
  uVar1 = (Data->super_DataExtractor).Data.Length;
  uVar2 = *OffsetPtr;
  uVar9 = uVar2;
  if (uVar1 < uVar2) {
    uVar9 = uVar1;
  }
  uVar10 = uVar1 - uVar9;
  if (uVar8 <= uVar1 - uVar9) {
    uVar10 = uVar8;
  }
  (this->Value).data = (uint8_t *)0x0;
  if (uVar10 == 0) {
    return true;
  }
  (this->Value).data = (uint8_t *)(pcVar7 + uVar9);
  *OffsetPtr = uVar8 + uVar2;
  return true;
switchD_00d9b229_caseD_16:
  uVar8 = DataExtractor::getULEB128(&Data->super_DataExtractor,OffsetPtr,(Error *)0x0);
  this->Form = (Form)uVar8;
  goto LAB_00d9b216;
switchD_00d9b229_caseD_e:
  bVar4 = dwarf::FormParams::getDwarfOffsetByteSize(local_34);
  uVar11 = (uint)bVar4;
LAB_00d9b29f:
  SecNdx = (uint64_t *)0x0;
  goto LAB_00d9b2a7;
}

Assistant:

bool DWARFFormValue::extractValue(const DWARFDataExtractor &Data,
                                  uint64_t *OffsetPtr, dwarf::FormParams FP,
                                  const DWARFContext *Ctx,
                                  const DWARFUnit *CU) {
  if (!Ctx && CU)
    Ctx = &CU->getContext();
  C = Ctx;
  U = CU;
  bool Indirect = false;
  bool IsBlock = false;
  Value.data = nullptr;
  // Read the value for the form into value and follow and DW_FORM_indirect
  // instances we run into
  do {
    Indirect = false;
    switch (Form) {
    case DW_FORM_addr:
    case DW_FORM_ref_addr: {
      uint16_t Size =
          (Form == DW_FORM_addr) ? FP.AddrSize : FP.getRefAddrByteSize();
      Value.uval = Data.getRelocatedValue(Size, OffsetPtr, &Value.SectionIndex);
      break;
    }
    case DW_FORM_exprloc:
    case DW_FORM_block:
      Value.uval = Data.getULEB128(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_block1:
      Value.uval = Data.getU8(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_block2:
      Value.uval = Data.getU16(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_block4:
      Value.uval = Data.getU32(OffsetPtr);
      IsBlock = true;
      break;
    case DW_FORM_data1:
    case DW_FORM_ref1:
    case DW_FORM_flag:
    case DW_FORM_strx1:
    case DW_FORM_addrx1:
      Value.uval = Data.getU8(OffsetPtr);
      break;
    case DW_FORM_data2:
    case DW_FORM_ref2:
    case DW_FORM_strx2:
    case DW_FORM_addrx2:
      Value.uval = Data.getU16(OffsetPtr);
      break;
    case DW_FORM_strx3:
      Value.uval = Data.getU24(OffsetPtr);
      break;
    case DW_FORM_data4:
    case DW_FORM_ref4:
    case DW_FORM_ref_sup4:
    case DW_FORM_strx4:
    case DW_FORM_addrx4:
      Value.uval = Data.getRelocatedValue(4, OffsetPtr);
      break;
    case DW_FORM_data8:
    case DW_FORM_ref8:
    case DW_FORM_ref_sup8:
      Value.uval = Data.getRelocatedValue(8, OffsetPtr);
      break;
    case DW_FORM_data16:
      // Treat this like a 16-byte block.
      Value.uval = 16;
      IsBlock = true;
      break;
    case DW_FORM_sdata:
      Value.sval = Data.getSLEB128(OffsetPtr);
      break;
    case DW_FORM_udata:
    case DW_FORM_ref_udata:
    case DW_FORM_rnglistx:
      Value.uval = Data.getULEB128(OffsetPtr);
      break;
    case DW_FORM_string:
      Value.cstr = Data.getCStr(OffsetPtr);
      break;
    case DW_FORM_indirect:
      Form = static_cast<dwarf::Form>(Data.getULEB128(OffsetPtr));
      Indirect = true;
      break;
    case DW_FORM_strp:
    case DW_FORM_sec_offset:
    case DW_FORM_GNU_ref_alt:
    case DW_FORM_GNU_strp_alt:
    case DW_FORM_line_strp:
    case DW_FORM_strp_sup: {
      Value.uval =
          Data.getRelocatedValue(FP.getDwarfOffsetByteSize(), OffsetPtr);
      break;
    }
    case DW_FORM_flag_present:
      Value.uval = 1;
      break;
    case DW_FORM_ref_sig8:
      Value.uval = Data.getU64(OffsetPtr);
      break;
    case DW_FORM_GNU_addr_index:
    case DW_FORM_GNU_str_index:
    case DW_FORM_addrx:
    case DW_FORM_strx:
      Value.uval = Data.getULEB128(OffsetPtr);
      break;
    default:
      // DWARFFormValue::skipValue() will have caught this and caused all
      // DWARF DIEs to fail to be parsed, so this code is not be reachable.
      llvm_unreachable("unsupported form");
    }
  } while (Indirect);

  if (IsBlock) {
    StringRef Str = Data.getData().substr(*OffsetPtr, Value.uval);
    Value.data = nullptr;
    if (!Str.empty()) {
      Value.data = Str.bytes_begin();
      *OffsetPtr += Value.uval;
    }
  }

  return true;
}